

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Buffer::RemoveReadChain(Buffer *this,uint32_t l)

{
  ushort uVar1;
  BufferChain *pBVar2;
  int iVar3;
  uint32_t uVar4;
  ushort uVar5;
  BufferChain *pBVar6;
  uint uVar7;
  uint uVar8;
  
  pBVar6 = this->m_head;
  if (l < this->len) {
    uVar7 = l;
    if (l != 0 && pBVar6 != (BufferChain *)0x0) {
      do {
        uVar1 = pBVar6->read;
        uVar5 = pBVar6->write - uVar1;
        if (pBVar6->write < uVar1) {
          __assert_fail("write >= read",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                        ,0x14,"uint16_t BufferChain::GetCanReadCount()");
        }
        if (uVar5 == 0) {
          pBVar6 = pBVar6->nextpkt;
          (*this->_vptr_Buffer[1])(this);
          this->m_head = pBVar6;
          iVar3 = 3;
          uVar8 = uVar7;
        }
        else {
          uVar8 = uVar7 - uVar5;
          if (uVar7 < uVar5) {
            pBVar6->read = uVar1 + (short)uVar7;
            iVar3 = 2;
            uVar8 = uVar7;
          }
          else {
            pBVar6 = pBVar6->nextpkt;
            (*this->_vptr_Buffer[1])(this);
            this->m_head = pBVar6;
            iVar3 = 0;
          }
        }
      } while ((((iVar3 == 3) || (iVar3 == 0)) && (pBVar6 != (BufferChain *)0x0)) &&
              (uVar7 = uVar8, uVar8 != 0));
    }
    if (this->m_head == (BufferChain *)0x0) {
      this->m_end = (BufferChain *)0x0;
    }
    this->len = this->len - l;
  }
  else {
    while (pBVar6 != (BufferChain *)0x0) {
      if (pBVar6->refcount == 0) {
        __assert_fail("tmp->refcount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.h"
                      ,0x2d,"void Buffer::Clear()");
      }
      pBVar2 = pBVar6->nextpkt;
      uVar4 = pBVar6->refcount - 1;
      pBVar6->refcount = uVar4;
      pBVar6 = pBVar2;
      if (uVar4 == 0) {
        (*this->_vptr_Buffer[1])(this);
      }
    }
    this->len = 0;
    this->m_writeHead = (BufferChain *)0x0;
    this->m_writeTail = (BufferChain *)0x0;
    this->m_head = (BufferChain *)0x0;
    this->m_end = (BufferChain *)0x0;
  }
  return;
}

Assistant:

void Buffer::RemoveReadChain(uint32_t l)
{
    if(l >= len)
    {
        Clear();
        return;
    }
    uint32_t rlen = l;
    for(BufferChain* buff = this->m_head; buff != nullptr && rlen > 0;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            continue;
        }
        if(rlen < canReadCount)
        {
            buff->read += rlen;
            break;
        }
        else
        {
            rlen -= canReadCount;
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
        }
    }
    if(m_head == nullptr)
        m_end = nullptr;

    len -= l;
}